

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall spdlog::pattern_formatter::compile_pattern_(pattern_formatter *this,string *pattern)

{
  pointer puVar1;
  flag_formatter *pfVar2;
  pointer pcVar3;
  _Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false> _Var4;
  const_iterator cVar5;
  pointer __p_1;
  pointer __p;
  pointer *__ptr_1;
  pointer puVar6;
  pointer *__ptr;
  pointer puVar7;
  char *pcVar8;
  const_iterator end;
  padding_info pVar9;
  padding_info padding;
  padding_info padding_00;
  _Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false> local_48;
  const_iterator local_40;
  _Head_base<0UL,_spdlog::details::aggregate_formatter_*,_false> local_38;
  
  pcVar8 = (pattern->_M_dataplus)._M_p;
  end._M_current = pcVar8 + pattern->_M_string_length;
  local_48._M_head_impl = (aggregate_formatter *)0x0;
  puVar1 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->formatters_).
           super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar7 = puVar1;
  if (puVar6 != puVar1) {
    do {
      pfVar2 = (puVar7->_M_t).
               super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
               ._M_t.
               super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
               .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl;
      if (pfVar2 != (flag_formatter *)0x0) {
        (*pfVar2->_vptr_flag_formatter[1])();
      }
      (puVar7->_M_t).
      super___uniq_ptr_impl<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
      ._M_t.
      super__Tuple_impl<0UL,_spdlog::details::flag_formatter_*,_std::default_delete<spdlog::details::flag_formatter>_>
      .super__Head_base<0UL,_spdlog::details::flag_formatter_*,_false>._M_head_impl =
           (flag_formatter *)0x0;
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar6);
    (this->formatters_).
    super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar1;
    pcVar8 = (pattern->_M_dataplus)._M_p;
  }
  if (pcVar8 != end._M_current) {
    do {
      _Var4._M_head_impl = local_48._M_head_impl;
      local_40._M_current = pcVar8;
      if (*pcVar8 == '%') {
        if (local_48._M_head_impl != (aggregate_formatter *)0x0) {
          local_48._M_head_impl = (aggregate_formatter *)0x0;
          local_38._M_head_impl = _Var4._M_head_impl;
          std::
          vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
          ::
          emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                    ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                      *)&this->formatters_,
                     (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                      *)&local_38);
          if (local_38._M_head_impl != (aggregate_formatter *)0x0) {
            (*((local_38._M_head_impl)->super_flag_formatter)._vptr_flag_formatter[1])();
          }
        }
        local_40._M_current = pcVar8 + 1;
        pVar9 = handle_padspec_(&local_40,end);
        cVar5._M_current = local_40._M_current;
        if (local_40._M_current == end._M_current) break;
        puVar6 = (pointer)((ulong)puVar6 & 0xffff000000000000 | pVar9._8_8_ & 0xffffffffffff);
        if ((pVar9._8_8_ >> 0x28 & 1) == 0) {
          padding._8_8_ = puVar6;
          padding.width_ = pVar9.width_;
          handle_flag_<spdlog::details::null_scoped_padder>(this,*local_40._M_current,padding);
          local_40._M_current = cVar5._M_current;
        }
        else {
          padding_00._8_8_ = puVar6;
          padding_00.width_ = pVar9.width_;
          handle_flag_<spdlog::details::scoped_padder>(this,*local_40._M_current,padding_00);
          local_40._M_current = cVar5._M_current;
        }
      }
      else {
        if (local_48._M_head_impl == (aggregate_formatter *)0x0) {
          __p = (pointer)operator_new(0x38);
          (__p->super_flag_formatter)._vptr_flag_formatter = (_func_int **)0x0;
          (__p->super_flag_formatter).padinfo_.width_ = 0;
          (__p->super_flag_formatter).padinfo_.side_ = left;
          (__p->super_flag_formatter).padinfo_.truncate_ = false;
          (__p->super_flag_formatter).padinfo_.enabled_ = false;
          *(undefined2 *)&(__p->super_flag_formatter).padinfo_.field_0xe = 0;
          (__p->str_)._M_dataplus._M_p = (pointer)0x0;
          (__p->str_)._M_string_length = 0;
          (__p->str_).field_2._M_allocated_capacity = 0;
          *(undefined8 *)((long)&(__p->str_).field_2 + 8) = 0;
          (__p->super_flag_formatter)._vptr_flag_formatter =
               (_func_int **)&PTR__aggregate_formatter_0015b590;
          (__p->str_)._M_dataplus._M_p = (pointer)&(__p->str_).field_2;
          std::
          __uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
          ::reset((__uniq_ptr_impl<spdlog::details::aggregate_formatter,_std::default_delete<spdlog::details::aggregate_formatter>_>
                   *)&local_48,__p);
        }
        std::__cxx11::string::push_back((char)local_48._M_head_impl + '\x18');
      }
      pcVar8 = local_40._M_current + 1;
    } while (pcVar8 != end._M_current);
    local_40._M_current = (char *)local_48._M_head_impl;
    if (local_48._M_head_impl != (aggregate_formatter *)0x0) {
      local_48._M_head_impl = (aggregate_formatter *)0x0;
      std::
      vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
      ::
      emplace_back<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>
                ((vector<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>,std::allocator<std::unique_ptr<spdlog::details::flag_formatter,std::default_delete<spdlog::details::flag_formatter>>>>
                  *)&this->formatters_,
                 (unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                  *)&local_40);
      if ((aggregate_formatter *)local_40._M_current != (aggregate_formatter *)0x0) {
        (**(code **)(*(long *)local_40._M_current + 8))();
      }
      _Var4._M_head_impl = local_48._M_head_impl;
      if (local_48._M_head_impl != (aggregate_formatter *)0x0) {
        pcVar3 = ((local_48._M_head_impl)->str_)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != &((local_48._M_head_impl)->str_).field_2) {
          operator_delete(pcVar3);
        }
        operator_delete(_Var4._M_head_impl);
      }
    }
  }
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::compile_pattern_(const std::string &pattern)
{
    auto end = pattern.end();
    std::unique_ptr<details::aggregate_formatter> user_chars;
    formatters_.clear();
    for (auto it = pattern.begin(); it != end; ++it)
    {
        if (*it == '%')
        {
            if (user_chars) // append user chars found so far
            {
                formatters_.push_back(std::move(user_chars));
            }

            auto padding = handle_padspec_(++it, end);

            if (it != end)
            {
                if (padding.enabled())
                {
                    handle_flag_<details::scoped_padder>(*it, padding);
                }
                else
                {
                    handle_flag_<details::null_scoped_padder>(*it, padding);
                }
            }
            else
            {
                break;
            }
        }
        else // chars not following the % sign should be displayed as is
        {
            if (!user_chars)
            {
                user_chars = details::make_unique<details::aggregate_formatter>();
            }
            user_chars->add_ch(*it);
        }
    }
    if (user_chars) // append raw chars found so far
    {
        formatters_.push_back(std::move(user_chars));
    }
}